

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  FieldDescriptor *arg;
  Mutex *this_00;
  long lVar1;
  GoogleOnceDynamic *pGVar2;
  int iVar3;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar5;
  long lVar6;
  long lVar7;
  Symbol SVar8;
  long lVar4;
  
  this_00 = this->builder_->pool_->mutex_;
  if (this_00 != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this_00);
  }
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  lVar4 = CONCAT44(extraout_var,iVar3);
  SVar8 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar4 + 8),LOOKUP_ALL,true);
  aVar5 = SVar8.field_1;
  if (SVar8.type == MESSAGE) {
    if ((*(char *)(*(long *)(lVar4 + 0x20) + 0x68) == '\x01') &&
       (0 < *(int *)(aVar5.descriptor + 0x78))) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar1 = *(long *)(aVar5.descriptor + 0x80);
        if (*(long *)(lVar1 + 0x58 + lVar7) == lVar4) {
          arg = (FieldDescriptor *)(lVar1 + lVar7);
          pGVar2 = *(GoogleOnceDynamic **)(lVar1 + 0x40 + lVar7);
          if (pGVar2 != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (pGVar2,FieldDescriptor::TypeOnceInit,arg);
          }
          if ((*(int *)(lVar1 + 0x48 + lVar7) == 0xb) && (*(int *)(lVar1 + 0x4c + lVar7) == 1)) {
            pGVar2 = *(GoogleOnceDynamic **)(lVar1 + 0x40 + lVar7);
            if (pGVar2 != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (pGVar2,FieldDescriptor::TypeOnceInit,arg);
            }
            if (*(FieldDescriptor **)(lVar1 + 0x70 + lVar7) == (FieldDescriptor *)aVar5.descriptor)
            {
              return arg;
            }
          }
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xa8;
      } while (lVar6 < *(int *)(aVar5.descriptor + 0x78));
    }
  }
  else if ((SVar8.type == FIELD) &&
          (*(FieldDescriptor *)(aVar5.descriptor + 0x50) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar5.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }